

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Farm.cpp
# Opt level: O2

void __thiscall Farm::clearBaskets(Farm *this)

{
  Menu showMenu;
  allocator local_e9;
  string local_e8;
  string local_c8;
  string local_a8;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  Menu local_48;
  
  std::__cxx11::string::string((string *)&local_a8,"Clear deliveries made from file?",&local_e9);
  Menu::Menu(&local_48,&local_a8,false);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string((string *)&local_c8,"No",&local_e9);
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_70 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Context/Farm.cpp:271:30)>
             ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Context/Farm.cpp:271:30)>
             ::_M_manager;
  Menu::addOption(&local_48,&local_c8,(function<void_()> *)&local_88);
  std::_Function_base::~_Function_base((_Function_base *)&local_88);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::string((string *)&local_e8,"Yes",&local_e9);
  local_68._8_8_ = 0;
  local_50 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Context/Farm.cpp:272:31)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Context/Farm.cpp:272:31)>
             ::_M_manager;
  local_68._M_unused._M_object = this;
  Menu::addOption(&local_48,&local_e8,(function<void_()> *)&local_68);
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  std::__cxx11::string::~string((string *)&local_e8);
  Menu::start(&local_48);
  Menu::~Menu(&local_48);
  return;
}

Assistant:

void Farm::clearBaskets() {
    Menu showMenu("Clear deliveries made from file?", false);
    showMenu.addOption("No", EXIT);
    showMenu.addOption("Yes", [&](){ baskets.clear(); cout << "Baskets successfully removed!" << endl; clientsFileChanged = true; enterWait();});
    showMenu.start();
}